

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::CheckboxFlags(char *label,uint *flags,uint flags_value)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  uint uVar4;
  bool v;
  bool local_21;
  
  uVar4 = *flags & flags_value;
  if (uVar4 != 0 && uVar4 != flags_value) {
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->WriteAccessed = true;
    uVar1 = (pIVar2->DC).ItemFlags;
    (pIVar2->DC).ItemFlags = uVar1 | 0x40;
    bVar3 = Checkbox(label,&local_21);
    (pIVar2->DC).ItemFlags = uVar1;
  }
  else {
    bVar3 = Checkbox(label,&local_21);
  }
  if (bVar3 == false) {
    bVar3 = false;
  }
  else {
    if (uVar4 != flags_value) {
      uVar4 = ~flags_value & *flags;
    }
    else {
      uVar4 = flags_value | *flags;
    }
    *flags = uVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ImGui::CheckboxFlags(const char* label, unsigned int* flags, unsigned int flags_value)
{
    bool v = ((*flags & flags_value) == flags_value);
    bool pressed;
    if (v == false && (*flags & flags_value) != 0)
    {
        // Mixed value (FIXME: find a way to expose neatly to Checkbox?)
        ImGuiWindow* window = GetCurrentWindow();
        const ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &v);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        // Regular checkbox
        pressed = Checkbox(label, &v);
    }
    if (pressed)
    {
        if (v)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }

    return pressed;
}